

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktInfoTests.cpp
# Opt level: O2

TestStatus *
vkt::anon_unknown_0::logPlatformInfo(TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *this;
  int iVar1;
  undefined4 extraout_var;
  ostringstream details;
  string asStack_328 [32];
  MessageBuilder local_308;
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  iVar1 = (*context->m_testCtx->m_platform->_vptr_Platform[5])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x18))
            ((long *)CONCAT44(extraout_var,iVar1),local_188);
  local_308.m_log = context->m_testCtx->m_log;
  this = &local_308.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)this,asStack_328);
  tcu::MessageBuilder::operator<<(&local_308,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string(asStack_328);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"Not validated",(allocator<char> *)asStack_328);
  tcu::TestStatus::pass(__return_storage_ptr__,(string *)&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus logPlatformInfo (Context& context)
{
	std::ostringstream details;

	context.getTestContext().getPlatform().getVulkanPlatform().describePlatform(details);

	context.getTestContext().getLog()
		<< TestLog::Message
		<< details.str()
		<< TestLog::EndMessage;

	return tcu::TestStatus::pass("Not validated");
}